

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void pmevcntr_rawwrite(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint uVar1;
  byte counter;
  
  uVar1 = (ri->opc2 & 7) + (ri->crm & 3) * 8;
  if (uVar1 < ((uint)(env->cp15).c9_pmcr >> 0xb & 0x1f)) {
    counter = (byte)uVar1;
    (env->cp15).c14_pmevcntr[counter] = value;
    pmevcntr_op_start(env,counter);
    (env->cp15).c14_pmevcntr[counter] = value;
    return;
  }
  __assert_fail("counter < pmu_num_counters(env)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                ,0x617,"void pmevcntr_rawwrite(CPUARMState *, const ARMCPRegInfo *, uint64_t)");
}

Assistant:

static void pmevcntr_rawwrite(CPUARMState *env, const ARMCPRegInfo *ri,
                             uint64_t value)
{
    uint8_t counter = ((ri->crm & 3) << 3) | (ri->opc2 & 7);
    assert(counter < pmu_num_counters(env));
    env->cp15.c14_pmevcntr[counter] = value;
    pmevcntr_write(env, ri, value, counter);
}